

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

JsonNode * jsonLookupAppend(JsonParse *pParse,char *zPath,int *pApnd,char **pzErr)

{
  char cVar1;
  u32 eType;
  JsonNode *pJVar2;
  
  *pApnd = 1;
  cVar1 = *zPath;
  if (cVar1 == '[') {
    if ((zPath[1] == '0') && (zPath[2] == ']')) {
      eType = 6;
      goto LAB_0018bc49;
    }
  }
  else {
    if (cVar1 == '.') {
      eType = 7;
LAB_0018bc49:
      jsonParseAddNode(pParse,eType,0,(char *)0x0);
      if (pParse->oom != '\0') {
        return (JsonNode *)0x0;
      }
      pJVar2 = jsonLookupStep(pParse,pParse->nNode - 1,zPath,pApnd,pzErr);
      return pJVar2;
    }
    if (cVar1 == '\0') {
      jsonParseAddNode(pParse,0,0,(char *)0x0);
      if (pParse->oom != '\0') {
        return (JsonNode *)0x0;
      }
      return pParse->aNode + (pParse->nNode - 1);
    }
  }
  return (JsonNode *)0x0;
}

Assistant:

static JsonNode *jsonLookupAppend(
  JsonParse *pParse,     /* Append content to the JSON parse */
  const char *zPath,     /* Description of content to append */
  int *pApnd,            /* Set this flag to 1 */
  const char **pzErr     /* Make this point to any syntax error */
){
  *pApnd = 1;
  if( zPath[0]==0 ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return pParse->oom ? 0 : &pParse->aNode[pParse->nNode-1];
  }
  if( zPath[0]=='.' ){
    jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
  }else if( strncmp(zPath,"[0]",3)==0 ){
    jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
  }else{
    return 0;
  }
  if( pParse->oom ) return 0;
  return jsonLookupStep(pParse, pParse->nNode-1, zPath, pApnd, pzErr);
}